

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

ValueType ToWabtValueType(wasm_valkind_t kind)

{
  wasm_valkind_t wVar1;
  undefined7 extraout_var;
  int iVar2;
  undefined7 in_register_00000039;
  Enum *pEVar3;
  
  iVar2 = (int)CONCAT71(in_register_00000039,kind);
  switch(CONCAT71(in_register_00000039,kind) & 0xffffffff) {
  case 0:
    return (ValueType)I32;
  case 1:
    return (ValueType)I64;
  case 2:
    return (ValueType)F32;
  case 3:
    return (ValueType)F64;
  }
  if (iVar2 == 0x80) {
    return (ValueType)Anyref;
  }
  if (iVar2 == 0x81) {
    return (ValueType)Funcref;
  }
  pEVar3 = (Enum *)(ulong)kind;
  ToWabtValueType();
  if (pEVar3 == (Enum *)0x0) {
    __assert_fail("type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x20c,"wasm_valkind_t wasm_valtype_kind(const wasm_valtype_t *)");
  }
  wVar1 = FromWabtValueType((ValueType)*pEVar3);
  return (ValueType)(Enum)CONCAT71(extraout_var,wVar1);
}

Assistant:

static ValueType ToWabtValueType(wasm_valkind_t kind) {
  switch (kind) {
    case WASM_I32:
      return ValueType::I32;
    case WASM_I64:
      return ValueType::I64;
    case WASM_F32:
      return ValueType::F32;
    case WASM_F64:
      return ValueType::F64;
    case WASM_ANYREF:
      return ValueType::Anyref;
    case WASM_FUNCREF:
      return ValueType::Funcref;
    default:
      TRACE("unexpected wasm_valkind_t: %d", kind);
      WABT_UNREACHABLE;
  }
  WABT_UNREACHABLE;
}